

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat-types.h
# Opt level: O1

Clause * __thiscall SAT::getConfl(SAT *this,Reason *r,Lit p)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  Clause *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  Clause *pCVar3;
  uint uVar4;
  
  pCVar3 = (Clause *)(r->field_0)._a;
  uVar4 = (uint)pCVar3 & 3;
  if (((ulong)pCVar3 & 3) != 0) {
    if (uVar4 == 1) {
      UNRECOVERED_JUMPTABLE = engine.propagators.data[(r->field_0)._a >> 0x20]->_vptr_Propagator[5];
      iVar2 = (*UNRECOVERED_JUMPTABLE)
                        (engine.propagators.data[(r->field_0)._a >> 0x20],(ulong)(uint)p.x,
                         (r->field_0)._a >> 2 & 0x3fffffff,UNRECOVERED_JUMPTABLE);
      return (Clause *)CONCAT44(extraout_var,iVar2);
    }
    pCVar1 = this->short_expl;
    *(uint *)pCVar1 = uVar4 << 8 | (uint)*(byte *)pCVar1;
    if (((ulong)pCVar3 & 3) == 0 || uVar4 == 1) {
      abort();
    }
    *(uint *)(pCVar1 + 1) = *(uint *)&r->field_0 >> 2;
    if (uVar4 == 3) {
      pCVar1[1].data[0].x = *(int *)((long)&r->field_0 + 4);
    }
    pCVar3 = this->short_expl;
  }
  return pCVar3;
}

Assistant:

unsigned int d1() const {
		assert(type() != 0);
		return static_cast<unsigned int>((_a & 0xFFFFFFFF) >> 2);
	}